

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.h
# Opt level: O1

LinkedToken * __thiscall Linker::getLinkedToken(Linker *this,Token *token)

{
  source_loc loc;
  source_loc loc_00;
  __normal_iterator<Cache<LinkedToken>::Entry_*,_std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>_>
  _Var1;
  logger *this_00;
  __normal_iterator<Cache<LinkedToken>::Entry_*,_std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>_>
  _Var2;
  string_view_t fmt;
  string_view_t fmt_00;
  Token *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<bool_(const_LinkedToken_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/linker/Linker.h:20:41)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_LinkedToken_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/linker/Linker.h:20:41)>
             ::_M_manager;
  local_38 = token;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<Cache<LinkedToken>::Entry*,std::vector<Cache<LinkedToken>::Entry,std::allocator<Cache<LinkedToken>::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Cache<LinkedToken>::find(std::function<bool(LinkedToken_const&)>)::_lambda(Cache<LinkedToken>::Entry_const&)_1_>>
                    ((this->tokenCache).entries.
                     super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->tokenCache).entries.
                     super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  _Var2._M_current = (Entry *)0x0;
  if (_Var1._M_current !=
      (this->tokenCache).entries.
      super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    _Var2 = _Var1;
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  this_00 = spdlog::default_logger_raw();
  if (_Var2._M_current == (Entry *)0x0) {
    loc_00.funcname = (char *)0x0;
    loc_00.filename = (char *)0x0;
    loc_00.line = 0;
    loc_00._12_4_ = 0;
    fmt_00.size_ = 0x22;
    fmt_00.data_ = "\'{}\' not in cache, starting search";
    spdlog::logger::log_<std::__cxx11::string_const&>(this_00,loc_00,info,fmt_00,&token->content);
    _Var2._M_current = (Entry *)searchForLink(this,token);
  }
  else {
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x13;
    fmt.data_ = "Found \'{}\' in cache";
    spdlog::logger::log_<std::__cxx11::string_const&>(this_00,loc,info,fmt,&token->content);
  }
  return &(_Var2._M_current)->data;
}

Assistant:

LinkedToken* getLinkedToken(const Token& token) {
			LinkedToken* entry = tokenCache.find([&](const LinkedToken& linkedToken) {
				return linkedToken == token;
			});

			if (entry != nullptr) {
				spdlog::info("Found '{}' in cache", token.content);
			} else {
				spdlog::info("'{}' not in cache, starting search", token.content);
				entry = searchForLink(token);
			}
			return entry;
		}